

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memstate.cc
# Opt level: O2

void __thiscall MemoryBank::getChunk(MemoryBank *this,uintb offset,int4 size,uint1 *res)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  
  iVar1 = this->pagesize;
  for (iVar6 = 0; uVar2 = size - iVar6, uVar2 != 0 && iVar6 <= size; iVar6 = iVar6 + uVar5) {
    uVar4 = offset & (long)-iVar1;
    uVar3 = (int)offset - (int)uVar4;
    uVar5 = this->pagesize - uVar3;
    if ((int)uVar2 < (int)uVar5) {
      uVar5 = uVar2;
    }
    (*this->_vptr_MemoryBank[2])(this,uVar4,res,(ulong)uVar3,(ulong)uVar5);
    offset = offset + (long)(int)uVar5;
    res = res + (int)uVar5;
  }
  return;
}

Assistant:

void MemoryBank::getChunk(uintb offset,int4 size,uint1 *res) const

{
  int4 cursize,count;
  uintb pagemask = (uintb) (pagesize-1);
  uintb offalign;
  int4 skip;

  count = 0;
  while(count < size) {
    cursize = pagesize;
    offalign = offset & ~pagemask;
    skip = 0;
    if (offalign != offset) {
      skip = offset-offalign;
      cursize -= skip;
    }
    if (size - count < cursize)
      cursize = size - count;
    getPage(offalign,res,skip,cursize);
    count += cursize;
    offset += cursize;
    res += cursize;
  }
}